

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoZ.cpp
# Opt level: O3

void __thiscall OpenMD::RhoZ::writeDensity(RhoZ *this)

{
  double *pdVar1;
  double *pdVar2;
  char cVar3;
  double *pdVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ofstream rdfStream;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  pdVar2 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar11 = 0.0;
  pdVar1 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar4 = pdVar1; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
    dVar11 = dVar11 + *pdVar4;
  }
  std::ofstream::ofstream
            (&local_228,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    snprintf(painCave.errMsg,2000,"RhoZ: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"#Rho(",5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"#nFrames:\t",10);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_228,this->nProcessed_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"#selection: (",0xd);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"#",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tdensity (g cm^-3)\t",0x13);
    std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
    cVar3 = (char)&local_228;
    std::ostream::put(cVar3);
    std::ostream::flush();
    *(undefined8 *)(local_220 + *(long *)(local_228 + -0x18)) = 8;
    lVar6 = (long)(this->density_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->density_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar6 != 0) {
      lVar9 = (long)pdVar2 - (long)pdVar1;
      lVar10 = lVar9 >> 3;
      auVar12._8_4_ = (int)(lVar9 >> 0x23);
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = 0x45300000;
      uVar7 = lVar6 >> 3;
      uVar8 = 0;
      do {
        auVar13._8_4_ = (int)(uVar7 >> 0x20);
        auVar13._0_8_ = uVar7;
        auVar13._12_4_ = 0x45300000;
        poVar5 = std::ostream::_M_insert<double>
                           ((((double)uVar8 + 0.5) *
                            (dVar11 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0
                                      )))) /
                            ((auVar13._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        poVar5 = std::ostream::_M_insert<double>
                           (((this->density_).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar8] * 1.66053886) /
                            (double)this->nProcessed_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        std::ios::widen((char)*(undefined8 *)(local_228 + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        uVar8 = (ulong)((int)uVar8 + 1);
        uVar7 = (long)(this->density_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->density_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
      } while (uVar8 < uVar7);
    }
  }
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void RhoZ::writeDensity() {
    // compute average box length:
    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#Rho(" << axisLabel_ << ")\n";
      rdfStream << "#nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#" << axisLabel_ << "\tdensity (g cm^-3)\t";

      rdfStream << std::endl;

      rdfStream.precision(8);  // same precision as the RNEMD files

      for (unsigned int i = 0; i < density_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / density_.size();
        rdfStream << z << "\t"
                  << Constants::densityConvert * density_[i] / nProcessed_
                  << "\t";

        rdfStream << std::endl;
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RhoZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }